

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glTFAsset.h
# Opt level: O3

void __thiscall glTF::Mesh::~Mesh(Mesh *this)

{
  list<glTF::Mesh::SExtension_*,_std::allocator<glTF::Mesh::SExtension_*>_> *plVar1;
  _List_node_base *p_Var2;
  _Node_conflict1 *__tmp;
  _List_node_base *p_Var3;
  
  (this->super_Object)._vptr_Object = (_func_int **)&PTR_IsSpecial_0080ca68;
  plVar1 = &this->Extension;
  p_Var3 = (this->Extension).
           super__List_base<glTF::Mesh::SExtension_*,_std::allocator<glTF::Mesh::SExtension_*>_>.
           _M_impl._M_node.super__List_node_base._M_next;
  if (p_Var3 != (_List_node_base *)plVar1) {
    do {
      if (p_Var3[1]._M_next != (_List_node_base *)0x0) {
        (**(code **)((long)(p_Var3[1]._M_next)->_M_next + 8))();
      }
      p_Var3 = p_Var3->_M_next;
    } while (p_Var3 != (_List_node_base *)plVar1);
    p_Var3 = (plVar1->
             super__List_base<glTF::Mesh::SExtension_*,_std::allocator<glTF::Mesh::SExtension_*>_>).
             _M_impl._M_node.super__List_node_base._M_next;
  }
  while (p_Var3 != (_List_node_base *)plVar1) {
    p_Var2 = p_Var3->_M_next;
    operator_delete(p_Var3,0x18);
    p_Var3 = p_Var2;
  }
  std::vector<glTF::Mesh::Primitive,_std::allocator<glTF::Mesh::Primitive>_>::~vector
            (&this->primitives);
  Object::~Object(&this->super_Object);
  return;
}

Assistant:

~Mesh() { for(std::list<SExtension*>::iterator it = Extension.begin(), it_end = Extension.end(); it != it_end; it++) { delete *it; }; }